

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RateCodingSynapse.cpp
# Opt level: O3

void __thiscall RateCodingSynapse::update(RateCodingSynapse *this)

{
  pointer pdVar1;
  _Elt_pointer pdVar2;
  _Map_pointer ppdVar3;
  double *pdVar4;
  double *pdVar5;
  Population *pPVar6;
  int iVar7;
  _Map_pointer ppdVar8;
  double *pdVar9;
  ulong uVar10;
  _func_int **value;
  double dVar11;
  double currentTime;
  double local_28;
  
  local_28 = Clock::getCurrentTime(this->clock);
  iVar7 = this->inputSize;
  value = (_func_int **)0x0;
  if (0 < iVar7) {
    uVar10 = 0;
    do {
      if ((((this->super_Synapse).from_population)->output).
          super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar10]->type == Spike) {
        pdVar1 = (this->spikes).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar2 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (pdVar2 == pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                    ((deque<double,std::allocator<double>> *)(pdVar1 + uVar10),&local_28);
        }
        else {
          *pdVar2 = local_28;
          *(_Elt_pointer *)((deque<double,std::allocator<double>> *)(pdVar1 + uVar10) + 0x30) =
               pdVar2 + 1;
        }
        Logging::logEvent(this->logger,1,(int)uVar10,0);
      }
      while( true ) {
        pdVar1 = (this->spikes).
                 super__Vector_base<std::deque<double,_std::allocator<double>_>,_std::allocator<std::deque<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        ppdVar3 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node;
        ppdVar8 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        pdVar4 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        pdVar9 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
        pdVar5 = pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
        if ((((long)pdVar5 - (long)pdVar9 >> 3) +
             ((long)pdVar4 -
              (long)pdVar1[uVar10].super__Deque_base<double,_std::allocator<double>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppdVar3 - (long)ppdVar8) >> 3) - 1) +
             (ulong)(ppdVar3 == (_Map_pointer)0x0)) * 0x40 == 0) ||
           (dVar11 = local_28 - this->param->time_window, dVar11 < *pdVar9 || dVar11 == *pdVar9))
        break;
        std::deque<double,_std::allocator<double>_>::pop_front(pdVar1 + uVar10);
      }
      while (pdVar9 != pdVar4) {
        value = (_func_int **)((double)value + 1.0);
        pdVar9 = pdVar9 + 1;
        if (pdVar9 == pdVar5) {
          pdVar9 = ppdVar8[1];
          ppdVar8 = ppdVar8 + 1;
          pdVar5 = pdVar9 + 0x40;
        }
      }
      if (this->singleOutput == false) {
        (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar10][1]._vptr_Event = value;
        pPVar6 = (this->super_Synapse).to_population;
        (*pPVar6->_vptr_Population[5])(pPVar6,uVar10 & 0xffffffff);
        Logging::logValue(this->logger,(long)this,(int)uVar10,3,(double)value);
        value = (_func_int **)0x0;
      }
      uVar10 = uVar10 + 1;
      iVar7 = this->inputSize;
    } while ((long)uVar10 < (long)iVar7);
  }
  if (this->singleOutput != false) {
    (*(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
      super__Vector_impl_data._M_start)[1]._vptr_Event =
         (_func_int **)((double)value / (double)iVar7);
    pPVar6 = (this->super_Synapse).to_population;
    (*pPVar6->_vptr_Population[5])(pPVar6,0);
    Logging::logValue(this->logger,(long)this,0,3,(double)value / (double)iVar7);
  }
  return;
}

Assistant:

void RateCodingSynapse::update() {
    double currentTime = clock->getCurrentTime();
    double value = 0.0;
    for(int i = 0; i < inputSize; i++) {
        if(from_population->output[i]->type == EventType::Spike) {
            spikes[i].push_back(currentTime);
            logger->logEvent(1, i, EventType::Spike);
        }
        while(spikes[i].size() && spikes[i].front() < currentTime - param->time_window) {
            spikes[i].pop_front(); 
        }
        for(double t : spikes[i]) {
            value += 1;
        }
        if(!singleOutput) {
            static_cast<ValueEvent*>(output[i])->setValue(value);
            to_population->setInput(i, output[i]);
            logger->logValue((long)this, i, EventType::Value, value);
            value = 0.0;
        }
    }
    value = value / (double)inputSize;
    if(singleOutput) {
        static_cast<ValueEvent*>(output[0])->setValue(value);
        to_population->setInput(0, output[0]);
        logger->logValue((long)this, 0, EventType::Value, value);
    }
}